

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

void cmd_set_repeat(wchar_t nrepeats)

{
  command *cmd;
  wchar_t nrepeats_local;
  
  cmd_queue[(cmd_tail + L'\x13') % 0x14].nrepeats = nrepeats;
  repeating = nrepeats != L'\0';
  player->upkeep->redraw = player->upkeep->redraw | 0x8000;
  return;
}

Assistant:

void cmd_set_repeat(int nrepeats)
{
	struct command *cmd = &cmd_queue[prev_cmd_idx(cmd_tail)];

	cmd->nrepeats = nrepeats;
	if (nrepeats) repeating = true;
	else repeating = false;

	/* Redraw the state (later) */
	player->upkeep->redraw |= (PR_STATE);
}